

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O0

Gia_Man_t *
Dar_NewChoiceSynthesis
          (Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fPower,int fLightSynth,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *p;
  Gia_Man_t *pGVar2;
  Aig_Man_t *pAVar3;
  void *Entry;
  void *Entry_00;
  Gia_Man_t *p_00;
  int local_44;
  int i;
  Gia_Man_t *pTemp;
  Gia_Man_t *pGia;
  Vec_Ptr_t *vGias;
  int fVerbose_local;
  int fLightSynth_local;
  int fPower_local;
  int fUpdateLevel_local;
  int fBalance_local;
  Aig_Man_t *pAig_local;
  
  fLightSynth_local = fUpdateLevel;
  if ((fUpdateLevel != 0) && (iVar1 = Dar_NewChoiceSynthesisGuard(pAig), iVar1 != 0)) {
    if (fVerbose != 0) {
      printf("Warning: Due to high fanout count of some nodes, level updating is disabled.\n");
    }
    fLightSynth_local = 0;
  }
  p = Vec_PtrAlloc(3);
  pGVar2 = Gia_ManFromAig(pAig);
  Vec_PtrPush(p,pGVar2);
  pAVar3 = Dar_NewCompress(pAig,fBalance,fLightSynth_local,fPower,fVerbose);
  pGVar2 = Gia_ManFromAig(pAVar3);
  Vec_PtrPush(p,pGVar2);
  pAVar3 = Dar_NewCompress2(pAVar3,fBalance,fLightSynth_local,1,fPower,fLightSynth,fVerbose);
  pGVar2 = Gia_ManFromAig(pAVar3);
  Vec_PtrPush(p,pGVar2);
  Aig_ManStop(pAVar3);
  Entry = Vec_PtrPop(p);
  Entry_00 = Vec_PtrEntry(p,0);
  Vec_PtrPush(p,Entry_00);
  Vec_PtrWriteEntry(p,0,Entry);
  pGVar2 = Gia_ManChoiceMiter(p);
  for (local_44 = 0; iVar1 = Vec_PtrSize(p), local_44 < iVar1; local_44 = local_44 + 1) {
    p_00 = (Gia_Man_t *)Vec_PtrEntry(p,local_44);
    Gia_ManStop(p_00);
  }
  Vec_PtrFree(p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Dar_NewChoiceSynthesis( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fLightSynth, int fVerbose )
//alias resyn    "b; rw; rwz; b; rwz; b"
//alias resyn2   "b; rw; rf; b; rw; rwz; b; rfz; rwz; b"
{
    Vec_Ptr_t * vGias;
    Gia_Man_t * pGia, * pTemp;
    int i;

    if ( fUpdateLevel && Dar_NewChoiceSynthesisGuard(pAig) )
    {
        if ( fVerbose )
            printf( "Warning: Due to high fanout count of some nodes, level updating is disabled.\n" );
        fUpdateLevel = 0;
    }

    vGias = Vec_PtrAlloc( 3 );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );

    pAig = Dar_NewCompress( pAig, fBalance, fUpdateLevel, fPower, fVerbose );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );
//Aig_ManPrintStats( pAig );

    pAig = Dar_NewCompress2( pAig, fBalance, fUpdateLevel, 1, fPower, fLightSynth, fVerbose );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );
//Aig_ManPrintStats( pAig );

    Aig_ManStop( pAig );

    // swap around the first and the last
    pTemp = (Gia_Man_t *)Vec_PtrPop( vGias );
    Vec_PtrPush( vGias, Vec_PtrEntry(vGias,0) );
    Vec_PtrWriteEntry( vGias, 0, pTemp );

//    Aig_Man_t * pAig;
//    int i;
//    printf( "Choicing will be performed with %d AIGs:\n", Vec_PtrSize(p->vAigs) );
//    Vec_PtrForEachEntry( Aig_Man_t *, p->vAigs, pAig, i )
//        Aig_ManPrintStats( pAig );

    // derive the miter
    pGia = Gia_ManChoiceMiter( vGias );

    // cleanup
    Vec_PtrForEachEntry( Gia_Man_t *, vGias, pTemp, i )
        Gia_ManStop( pTemp );
    Vec_PtrFree( vGias );
    return pGia;
}